

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_tcp_addr_cpy(int fd,int family,sockaddr *addrinfo)

{
  char *pcVar1;
  size_t sVar2;
  char *local_30;
  char *result;
  sockaddr *addrinfo_local;
  int family_local;
  int fd_local;
  
  if (family == 2) {
    local_30 = addrinfo->sa_data + 2;
  }
  else {
    local_30 = addrinfo->sa_data + 6;
  }
  pcVar1 = inet_ntop(family,local_30,(char *)((long)fio_data + (long)fd * 0xa8 + 0x72),0x30);
  if (pcVar1 == (char *)0x0) {
    *(undefined1 *)((long)fio_data + (long)fd * 0xa8 + 0x71) = 0;
    *(undefined1 *)((long)fio_data + (long)fd * 0xa8 + 0x72) = 0;
  }
  else {
    sVar2 = strlen((char *)((long)fio_data + (long)fd * 0xa8 + 0x72));
    *(char *)((long)fio_data + (long)fd * 0xa8 + 0x71) = (char)sVar2;
  }
  return;
}

Assistant:

static void fio_tcp_addr_cpy(int fd, int family, struct sockaddr *addrinfo) {
  const char *result =
      inet_ntop(family,
                family == AF_INET
                    ? (void *)&(((struct sockaddr_in *)addrinfo)->sin_addr)
                    : (void *)&(((struct sockaddr_in6 *)addrinfo)->sin6_addr),
                (char *)fd_data(fd).addr, sizeof(fd_data(fd).addr));
  if (result) {
    fd_data(fd).addr_len = strlen((char *)fd_data(fd).addr);
  } else {
    fd_data(fd).addr_len = 0;
    fd_data(fd).addr[0] = 0;
  }
}